

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_cat(char **pdest,char *src,size_t *pndest)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  
  pcVar3 = *pdest;
  sVar4 = *pndest;
  pcVar1 = pcVar3 + sVar4;
  for (; (pcVar3 < pcVar1 && (*pcVar3 != '\0')); pcVar3 = pcVar3 + 1) {
    sVar4 = sVar4 - 1;
  }
  for (lVar5 = 0; (pcVar2 = pcVar3 + lVar5, pcVar2 < pcVar1 && (src[lVar5] != '\0'));
      lVar5 = lVar5 + 1) {
    *pcVar2 = src[lVar5];
    sVar4 = sVar4 - 1;
  }
  pcVar3[lVar5] = '\0';
  *pndest = sVar4;
  *pdest = pcVar2;
  return;
}

Assistant:

static void arg_cat(char** pdest, const char* src, size_t* pndest) {
    char* dest = *pdest;
    char* end = dest + *pndest;

    /*locate null terminator of dest string */
    while (dest < end && *dest != 0)
        dest++;

    /* concat src string to dest string */
    while (dest < end && *src != 0)
        *dest++ = *src++;

    /* null terminate dest string */
    *dest = 0;

    /* update *pdest and *pndest */
    *pndest = (size_t)(end - dest);
    *pdest = dest;
}